

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressTestUtil.cpp
# Opt level: O1

ProgramContext * __thiscall
deqp::gls::LongStressTestUtil::ProgramLibrary::generateTextureContext
          (ProgramContext *__return_storage_ptr__,ProgramLibrary *this,int numTextures,int texWid,
          int texHei,float positionFactor)

{
  vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_> *this_00;
  Vector<float,_4> *pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider vtxShaderSource_;
  int i;
  long lVar3;
  int iVar4;
  string local_198;
  ProgramContext *local_178;
  int local_170;
  int local_16c;
  Matrix<float,_4,_4> local_168;
  float local_128;
  VarSpec local_118;
  Matrix<float,_4,_4> local_70;
  
  pVVar1 = local_168.m_data.m_data + 1;
  local_170 = texWid;
  local_16c = texHei;
  local_168.m_data.m_data[0].m_data._0_8_ = pVVar1;
  local_128 = positionFactor;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,
             "${VTX_HEADER}${VTX_IN} highp vec3 a_position;\n${VTX_IN} mediump vec2 a_texCoord;\n${VTX_OUT} mediump vec2 v_texCoord;\nuniform mediump mat4 u_posTrans;\n\nvoid main (void)\n{\n\tgl_Position = u_posTrans * vec4(a_position, 1.0);\n\tv_texCoord = a_texCoord;\n}\n"
             ,"");
  substitute(&local_118.name,this,(string *)&local_168);
  vtxShaderSource_._M_p = local_118.name._M_dataplus._M_p;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_198,
             "${FRAG_HEADER}${FRAG_IN} mediump vec2 v_texCoord;\nuniform mediump sampler2D u_sampler;\n\nvoid main (void)\n{\n\t${FRAG_COLOR} = ${TEXTURE_2D_FUNC}(u_sampler, v_texCoord);\n}\n"
             ,"");
  substitute((string *)&local_70,this,&local_198);
  ProgramContext::ProgramContext
            (__return_storage_ptr__,vtxShaderSource_._M_p,
             (char *)local_70.m_data.m_data[0].m_data._0_8_,"a_position");
  if ((Vector<float,_4> *)local_70.m_data.m_data[0].m_data._0_8_ != local_70.m_data.m_data + 1) {
    operator_delete((void *)local_70.m_data.m_data[0].m_data._0_8_,
                    local_70.m_data.m_data[1].m_data._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_118.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.name._M_dataplus._M_p,local_118.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((Vector<float,_4> *)local_168.m_data.m_data[0].m_data._0_8_ != pVVar1) {
    operator_delete((void *)local_168.m_data.m_data[0].m_data._0_8_,
                    local_168.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_178 = __return_storage_ptr__;
  local_168.m_data.m_data[0].m_data._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"a_position","");
  lVar3 = 0;
  do {
    local_70.m_data.m_data[0].m_data[lVar3] = -local_128;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    *(float *)((long)&local_198._M_dataplus._M_p + lVar3 * 4) = local_128;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            (&local_118,(string *)&local_168,(Vector<float,_3> *)&local_70,
             (Vector<float,_3> *)&local_198);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(&__return_storage_ptr__->attributes,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.name._M_dataplus._M_p,local_118.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((Vector<float,_4> *)local_168.m_data.m_data[0].m_data._0_8_ != pVVar1) {
    operator_delete((void *)local_168.m_data.m_data[0].m_data._0_8_,
                    local_168.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_168.m_data.m_data[0].m_data._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"a_texCoord","");
  local_70.m_data.m_data[0].m_data._0_8_ = (pointer)0x0;
  lVar3 = 0;
  do {
    *(undefined4 *)((long)&local_198._M_dataplus._M_p + lVar3 * 4) = 0x3f800000;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  VarSpec::VarSpec<tcu::Vector<float,2>>
            (&local_118,(string *)&local_168,(Vector<float,_2> *)&local_70,
             (Vector<float,_2> *)&local_198);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(&__return_storage_ptr__->attributes,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.name._M_dataplus._M_p,local_118.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((Vector<float,_4> *)local_168.m_data.m_data[0].m_data._0_8_ != pVVar1) {
    operator_delete((void *)local_168.m_data.m_data[0].m_data._0_8_,
                    local_168.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_168.m_data.m_data[0].m_data._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"u_sampler","");
  local_118.name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_168.m_data.m_data[0].m_data._0_8_,
             (pointer)(local_168.m_data.m_data[0].m_data._0_8_ +
                      local_168.m_data.m_data[0].m_data._8_8_));
  local_118._32_8_ = 0x1b;
  local_118.maxValue.f[0] = 0.0;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(&__return_storage_ptr__->uniforms,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.name._M_dataplus._M_p,local_118.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((Vector<float,_4> *)local_168.m_data.m_data[0].m_data._0_8_ != pVVar1) {
    operator_delete((void *)local_168.m_data.m_data[0].m_data._0_8_,
                    local_168.m_data.m_data[1].m_data._0_8_ + 1);
  }
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"u_posTrans","");
  translationMat<4>(local_128 + -1.0);
  translationMat<4>(1.0 - local_128);
  VarSpec::VarSpec<tcu::Matrix<float,4,4>>(&local_118,&local_198,&local_168,&local_70);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(&__return_storage_ptr__->uniforms,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.name._M_dataplus._M_p,local_118.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (0 < numTextures) {
    this_00 = &local_178->textureSpecs;
    iVar4 = 0;
    do {
      lVar3 = 0;
      do {
        local_168.m_data.m_data[0].m_data[lVar3] = 1.0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_118.name._M_dataplus._M_p = (pointer)0x0;
      local_118.name._M_string_length._0_4_ = local_170;
      local_118.name._M_string_length._4_4_ = local_16c;
      local_118.name.field_2._M_allocated_capacity = 0x140100001908;
      local_118.name.field_2._8_4_ = 0x1908;
      local_118.name.field_2._M_local_buf[0xc] = '\x01';
      local_118._32_8_ = 0x260100002703;
      local_118.minValue._4_8_ = 0x290100002901;
      local_118.minValue._12_8_ = 0;
      local_118.minValue._20_8_ = 0;
      local_118.minValue.f[7] = local_168.m_data.m_data[0].m_data[0];
      local_118.minValue.f[8] = local_168.m_data.m_data[0].m_data[1];
      local_118.minValue.f[9] = local_168.m_data.m_data[0].m_data[2];
      local_118.minValue.f[10] = local_168.m_data.m_data[0].m_data[3];
      std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::
      emplace_back<deqp::gls::TextureSpec>(this_00,(TextureSpec *)&local_118);
      iVar4 = iVar4 + 1;
    } while (iVar4 != numTextures);
  }
  return local_178;
}

Assistant:

gls::ProgramContext ProgramLibrary::generateTextureContext (const int numTextures, const int texWid, const int texHei, const float positionFactor) const
{
	static const char* const vertexTemplate =
		"${VTX_HEADER}"
		"${VTX_IN} highp vec3 a_position;\n"
		"${VTX_IN} mediump vec2 a_texCoord;\n"
		"${VTX_OUT} mediump vec2 v_texCoord;\n"
		"uniform mediump mat4 u_posTrans;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = u_posTrans * vec4(a_position, 1.0);\n"
		"	v_texCoord = a_texCoord;\n"
		"}\n";

	static const char* const fragmentTemplate =
		"${FRAG_HEADER}"
		"${FRAG_IN} mediump vec2 v_texCoord;\n"
		"uniform mediump sampler2D u_sampler;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	${FRAG_COLOR} = ${TEXTURE_2D_FUNC}(u_sampler, v_texCoord);\n"
		"}\n";

	gls::ProgramContext context(substitute(vertexTemplate).c_str(), substitute(fragmentTemplate).c_str(), "a_position");

	context.attributes.push_back(gls::VarSpec("a_position",		Vec3(-positionFactor),						Vec3(positionFactor)));
	context.attributes.push_back(gls::VarSpec("a_texCoord",		Vec2(0.0f),									Vec2(1.0f)));

	context.uniforms.push_back(gls::VarSpec("u_sampler",		0));
	context.uniforms.push_back(gls::VarSpec("u_posTrans",		translationMat<4>(positionFactor-1.0f),		translationMat<4>(1.0f-positionFactor)));

	for (int i = 0; i < numTextures; i++)
		context.textureSpecs.push_back(gls::TextureSpec(glu::TextureTestUtil::TEXTURETYPE_2D, 0,
														texWid, texHei, GL_RGBA, GL_UNSIGNED_BYTE, GL_RGBA, true,
														GL_LINEAR_MIPMAP_LINEAR, GL_LINEAR, GL_REPEAT, GL_REPEAT,
														Vec4(0.0f), Vec4(1.0f)));

	return context;
}